

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O0

void nn_bipc_start_accepting(nn_bipc *self)

{
  void *pvVar1;
  nn_usock *in_RDI;
  int in_stack_0000000c;
  nn_aipc *in_stack_00000010;
  
  if (*(long *)&in_RDI[1].s != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->aipc == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
            ,0x159);
    fflush(_stderr);
    nn_err_abort();
  }
  pvVar1 = nn_alloc_(0x14e374);
  *(void **)&in_RDI[1].s = pvVar1;
  if (*(long *)&in_RDI[1].s == 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
            ,0x15d);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_aipc_init(in_stack_00000010,in_stack_0000000c,(nn_ep *)self,&in_RDI->fsm);
  nn_aipc_start((nn_aipc *)self,in_RDI);
  return;
}

Assistant:

static void nn_bipc_start_accepting (struct nn_bipc *self)
{
    nn_assert (self->aipc == NULL);

    /*  Allocate new aipc state machine. */
    self->aipc = nn_alloc (sizeof (struct nn_aipc), "aipc");
    alloc_assert (self->aipc);
    nn_aipc_init (self->aipc, NN_BIPC_SRC_AIPC, self->ep, &self->fsm);

    /*  Start waiting for a new incoming connection. */
    nn_aipc_start (self->aipc, &self->usock);
}